

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int query_attr(attr_list list,atom_t attr_id,attr_value_type *val_type_p,attr_value *value_p)

{
  int_attr_struct *piVar1;
  attr_p paVar2;
  int iVar3;
  int4 iVar4;
  ulong uVar5;
  long lVar6;
  
  if (list != (attr_list)0x0) {
    if (list->list_of_lists == 0) {
      piVar1 = (list->l).list.iattrs;
      if ((ulong)piVar1->int_attr_count != 0) {
        uVar5 = 0;
        do {
          if (piVar1->iattr[uVar5].attr_id == attr_id) {
            if (val_type_p != (attr_value_type *)0x0) {
              *val_type_p = Attr_Int4;
            }
            if (value_p == (attr_value *)0x0) {
              return 1;
            }
            iVar4 = ((list->l).list.iattrs)->iattr[uVar5].value;
            goto LAB_00104dea;
          }
          uVar5 = uVar5 + 1;
        } while (piVar1->int_attr_count != uVar5);
      }
      if (piVar1->other_attr_count == 0) {
        return 0;
      }
      paVar2 = (list->l).list.attributes;
      lVar6 = 0;
      do {
        if (*(int *)((long)&paVar2->attr_id + lVar6) == attr_id) {
          if (val_type_p != (attr_value_type *)0x0) {
            *val_type_p = *(attr_value_type *)((long)&paVar2->val_type + lVar6);
          }
          if (value_p == (attr_value *)0x0) {
            return 1;
          }
          paVar2 = (list->l).list.attributes;
          if (*(int *)((long)&paVar2->val_type + lVar6) != 1) {
            *value_p = *(attr_value *)((long)&(paVar2->value).u + lVar6);
            return 1;
          }
          iVar4 = *(int4 *)((long)&(paVar2->value).u + lVar6);
LAB_00104dea:
          *(int4 *)value_p = iVar4;
          return 1;
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)piVar1->other_attr_count * 0x18 != lVar6);
    }
    else {
      if ((list->l).lists.sublist_count < 1) {
        return 0;
      }
      lVar6 = 0;
      do {
        iVar3 = query_attr((list->l).lists.lists[lVar6],attr_id,val_type_p,value_p);
        if (iVar3 != 0) {
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (list->l).lists.sublist_count);
    }
  }
  return 0;
}

Assistant:

extern int
query_attr(attr_list list, atom_t attr_id, attr_value_type *val_type_p, attr_value *value_p)
{
    if (list == NULL) return 0;
    if (list->list_of_lists) {
        int i;
        for (i=0; i< list->l.lists.sublist_count; i++) {
            if (query_attr(list->l.lists.lists[i], attr_id, val_type_p,
                           value_p)) {
                return 1;
            }
        }
        return 0;
    } else {
	int index = 0;
	while(index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = Attr_Int4;
		}
		if (value_p != NULL) {
		    if (sizeof(long) != 4){
			*((int*)value_p) = (int)(long)list->l.list.iattrs->iattr[index].value;
		    } else {
			*((int*)value_p) = list->l.list.iattrs->iattr[index].value;
		    }
		}
		return 1;
	    }
	    index++;
        }
	index = 0;
	while(index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = list->l.list.attributes[index].val_type;
		}
		if (value_p != NULL) {
		    if ((sizeof(long) != 4) &&
			(list->l.list.attributes[index].val_type == Attr_Int4)){
			*((int*)value_p) = (int)(long)list->l.list.attributes[index].value.u.i;
		    } else {
			*value_p = list->l.list.attributes[index].value.u.l;
		    }
		}
		return 1;
	    }
	    index++;
        }
        return 0;
    }                 
}